

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshEdit.cpp
# Opt level: O1

void __thiscall
CMU462::HalfedgeMesh::buildSubdivisionVertexList
          (HalfedgeMesh *this,
          vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *subDVertices)

{
  return;
}

Assistant:

void HalfedgeMesh::buildSubdivisionVertexList( vector<Vector3D>& subDVertices )
  {
    // TODO Resize the vertex list so that it can hold all the vertices.

    // TODO Iterate over vertices, assigning Vertex::newPosition to the appropriate
    // location in the new vertex list.

    // TODO Iterate over edges, assigning Edge::newPosition to the appropriate
    // location in the new vertex list.

    // TODO Iterate over faces, assigning Face::newPosition to the appropriate
    // location in the new vertex list.
  }